

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::DecorationManager::AddDecoration(DecorationManager *this,Instruction *inst)

{
  pointer *pppIVar1;
  Op OVar2;
  uint32_t index;
  mapped_type *pmVar3;
  uint uVar4;
  uint index_00;
  iterator iVar5;
  uint uVar6;
  uint32_t target_id;
  Instruction *local_38;
  uint32_t local_2c;
  
  OVar2 = inst->opcode_;
  local_38 = inst;
  if ((int)OVar2 < 0x14c) {
    if (1 < OVar2 - OpDecorate) {
      if (1 < OVar2 - OpGroupDecorate) {
        return;
      }
      uVar4 = (OVar2 != OpGroupDecorate) + 1;
      index_00 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        index_00 = (uint)inst->has_result_id_;
      }
      if (uVar4 < (int)((ulong)((long)(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                  - index_00) {
        uVar6 = uVar4;
        do {
          local_2c = Instruction::GetSingleWordOperand(local_38,index_00 + uVar6);
          pmVar3 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this,&local_2c);
          iVar5._M_current =
               (pmVar3->indirect_decorations).
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (pmVar3->indirect_decorations).
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            _M_realloc_insert<spvtools::opt::Instruction*const&>
                      ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                        *)&pmVar3->indirect_decorations,iVar5,&local_38);
          }
          else {
            *iVar5._M_current = local_38;
            pppIVar1 = &(pmVar3->indirect_decorations).
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppIVar1 = *pppIVar1 + 1;
          }
          uVar6 = uVar6 + uVar4;
          index_00 = (local_38->has_result_id_ & 1) + 1;
          if (local_38->has_type_id_ == false) {
            index_00 = (uint)local_38->has_result_id_;
          }
        } while (uVar6 < (int)((ulong)((long)(local_38->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_38->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - index_00);
      }
      local_2c = Instruction::GetSingleWordOperand(local_38,index_00);
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_2c);
      iVar5._M_current =
           (pmVar3->decorate_insts).
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current !=
          (pmVar3->decorate_insts).
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        *iVar5._M_current = local_38;
        pppIVar1 = &(pmVar3->decorate_insts).
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + 1;
        return;
      }
      pmVar3 = (mapped_type *)&pmVar3->decorate_insts;
      goto LAB_001ef2d6;
    }
  }
  else if ((OVar2 != OpDecorateString) && (OVar2 != OpDecorateId)) {
    return;
  }
  index = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    index = (uint)inst->has_result_id_;
  }
  local_2c = Instruction::GetSingleWordOperand(inst,index);
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_2c);
  iVar5._M_current =
       (pmVar3->direct_decorations).
       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current !=
      (pmVar3->direct_decorations).
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    *iVar5._M_current = local_38;
    pppIVar1 = &(pmVar3->direct_decorations).
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
    return;
  }
LAB_001ef2d6:
  std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
  _M_realloc_insert<spvtools::opt::Instruction*const&>
            ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
             pmVar3,iVar5,&local_38);
  return;
}

Assistant:

void DecorationManager::AddDecoration(Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorate: {
      const auto target_id = inst->GetSingleWordInOperand(0u);
      id_to_decoration_insts_[target_id].direct_decorations.push_back(inst);
      break;
    }
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate: {
      const uint32_t start =
          inst->opcode() == spv::Op::OpGroupDecorate ? 1u : 2u;
      const uint32_t stride = start;
      for (uint32_t i = start; i < inst->NumInOperands(); i += stride) {
        const auto target_id = inst->GetSingleWordInOperand(i);
        TargetData& target_data = id_to_decoration_insts_[target_id];
        target_data.indirect_decorations.push_back(inst);
      }
      const auto target_id = inst->GetSingleWordInOperand(0u);
      id_to_decoration_insts_[target_id].decorate_insts.push_back(inst);
      break;
    }
    default:
      break;
  }
}